

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

longlong __thiscall mkvparser::Chapters::Atom::GetStopTime(Atom *this,Chapters *pChapters)

{
  longlong lVar1;
  
  lVar1 = GetTime(pChapters,this->m_stop_timecode);
  return lVar1;
}

Assistant:

long long Chapters::Atom::GetStopTime(const Chapters* pChapters) const {
  return GetTime(pChapters, m_stop_timecode);
}